

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O3

optional<tinyusdz::Prim> * __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimFromTypeName
          (optional<tinyusdz::Prim> *__return_storage_ptr__,Impl *this,string *typeName,
          string *primTypeName,string *prim_name,Node *node,Specifier spec,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *primChildren,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *properties,
          PathIndexToSpecIndexMap *psmap,PrimMeta *meta,bool *is_unsupported_prim)

{
  size_type sVar1;
  int *piVar2;
  long *plVar3;
  bool bVar4;
  bool bVar5;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *pvVar6;
  bool *pbVar7;
  bool bVar8;
  int iVar9;
  GeomMesh *pGVar10;
  PrimMeta *pPVar11;
  ostringstream *this_00;
  ostream *poVar12;
  optional<tinyusdz::Prim> *poVar13;
  Prim prim;
  Scope typed_prim;
  storage_union local_4d38;
  undefined1 local_4d28 [32];
  optional<tinyusdz::Prim> *local_4d08;
  string *local_4d00;
  undefined1 local_4cf8 [624];
  string local_4a88 [224];
  undefined1 local_49a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4998;
  undefined1 local_4988 [16];
  undefined1 local_4978 [32];
  undefined1 local_4958 [32];
  ios_base local_4938 [48];
  string local_4908 [32];
  storage_t<double> local_48e8 [5];
  string local_48c0 [632];
  undefined1 local_4648 [784];
  undefined1 local_4338 [144];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_42a8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_4290 [7];
  undefined1 local_41e8 [480];
  undefined1 local_4008 [40];
  undefined1 local_3fe0 [16];
  undefined1 local_3fd0 [16];
  undefined1 local_3fc0 [16];
  Specifier local_3fb0;
  undefined4 uStack_3fac;
  undefined8 local_3fa8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3fa0;
  undefined1 local_3f90 [16];
  undefined1 local_3f80 [32];
  undefined1 local_3f60 [40];
  undefined1 local_3f38 [8];
  undefined1 auStack_3f30 [32];
  undefined1 local_3f10 [16];
  undefined1 local_3f00 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3ef0;
  undefined1 local_3ee0;
  undefined1 local_3ed8 [24];
  undefined1 auStack_3ec0 [32];
  undefined1 local_3ea0 [16];
  undefined1 local_3e90 [32];
  undefined1 local_3e70 [16];
  undefined1 auStack_3e60 [16];
  undefined1 auStack_3e50 [16];
  undefined1 local_3e40 [32];
  undefined1 local_3e20 [16];
  undefined1 local_3e10 [16];
  undefined1 local_3e00 [16];
  undefined1 local_3df0 [24];
  undefined1 auStack_3dd8 [16];
  undefined1 local_3dc8 [16];
  undefined1 local_3db8 [24];
  undefined1 local_3da0 [16];
  undefined1 local_3d90 [24];
  undefined1 local_3d78 [16];
  undefined1 local_3d68 [16];
  undefined1 local_3d58 [16];
  undefined1 auStack_3d48 [16];
  undefined1 auStack_3d38 [16];
  undefined1 local_3d28 [16];
  undefined1 local_3d18 [16];
  undefined1 local_3d08 [24];
  undefined1 local_3cf0 [16];
  undefined1 local_3ce0 [16];
  undefined1 local_3cd0 [16];
  undefined1 auStack_3cc0 [24];
  undefined1 local_3ca8 [16];
  undefined1 auStack_3c98 [32];
  undefined1 local_3c78 [32];
  undefined1 local_3c58 [32];
  undefined1 local_3c38 [32];
  undefined1 local_3c18 [16];
  undefined1 auStack_3c08 [32];
  undefined1 local_3be8 [24];
  undefined1 auStack_3bd0 [16];
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  sStack_3bc0;
  undefined1 auStack_3ba0 [40];
  undefined1 auStack_3b78 [24];
  undefined1 local_3b60 [32];
  undefined1 local_3b40 [16];
  undefined1 local_3b30 [24];
  undefined1 auStack_3b18 [16];
  undefined1 auStack_3b08 [24];
  storage_t<tinyusdz::value::StringData> local_3af0 [3];
  undefined1 local_3a58 [120];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_39e0 [12];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_38b8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_38a0 [2];
  undefined1 local_3868 [544];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3648 [19];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3470;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3458 [29];
  undefined1 local_31a0 [704];
  undefined1 local_2ee0 [336];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2d90 [12];
  undefined1 local_2c68 [224];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2b88 [6];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2ae8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2ad0 [25];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2870;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2858 [428];
  
  pbVar7 = is_unsupported_prim;
  pvVar6 = properties;
  if (is_unsupported_prim != (bool *)0x0) {
    *is_unsupported_prim = false;
  }
  local_4d28._16_8_ = primTypeName;
  local_4d28._24_8_ = node;
  iVar9 = ::std::__cxx11::string::compare((char *)typeName);
  local_4d08 = __return_storage_ptr__;
  local_4d00 = typeName;
  if ((iVar9 == 0) || (iVar9 = ::std::__cxx11::string::compare((char *)typeName), iVar9 == 0)) {
    local_4978._0_8_ = local_4988;
    local_49a8._0_8_ = (pointer)0x0;
    local_49a8._8_8_ = (pointer)0x0;
    local_4998._M_allocated_capacity._0_4_ = 0;
    local_4998._M_local_buf[4] = '\0';
    local_4998._M_local_buf[5] = '\0';
    local_4998._M_local_buf[6] = '\0';
    local_4998._M_local_buf[7] = '\0';
    local_4988._0_4_ = _S_red;
    local_4988._8_8_ = (_Base_ptr)0x0;
    local_4978._16_8_ = 0;
    local_4978[0x18] = false;
    local_4978._8_8_ = local_4978._0_8_;
    memset(local_4338,0,0x308);
    local_41e8._448_4_ = _S_red;
    local_41e8._456_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    memset(local_4958,0,0x309);
    memset(local_4648,0,0x309);
    local_4008._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_4008._32_8_ = (long)local_4008 + 0x10;
    local_4008._16_4_ = _S_red;
    local_4008._24_8_ = (_Base_ptr)0x0;
    local_3fe0._8_8_ = 0;
    local_3fd0._0_8_ = local_3fc0;
    local_3fd0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3fc0[0] = '\0';
    _local_3fb0 = &local_3fa0;
    local_3fa8 = (char *)0x0;
    local_3fa0._M_local_buf[0] = false;
    local_3f90._0_4_ = Def;
    local_3f90._8_8_ = (anon_struct_8_0_00000001_for___align)0xffffffffffffffff;
    local_3f80._8_4_ = 0;
    local_3f80._16_8_ = local_3f60;
    local_3f80._0_4_ = 0;
    local_3f80[4] = '\0';
    local_3f80._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3f60[0] = '\0';
    local_3f60[0x10] = 0;
    local_3e10[8] = 0;
    local_3ca8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c98._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c98._8_8_ = (_Base_ptr)0x0;
    auStack_3c98._16_8_ = (_Base_ptr)0x0;
    local_3c78._16_8_ = local_3c78;
    local_3c78._0_4_ = _S_red;
    local_3c78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3f60._24_8_ = 0;
    local_3f60._32_8_ = 0;
    local_3f38 = (undefined1  [8])0x0;
    auStack_3f30._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f30._8_8_ = 0;
    auStack_3f30._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f30[0x18] = 0;
    local_3f10._0_8_ = 0;
    local_3f10._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3f00._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3f00._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ef0._M_allocated_capacity = 0;
    local_3ef0._8_8_ = 0;
    local_3ee0 = 0;
    local_3ed8._0_8_ = 0;
    local_3ed8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ed8._16_8_ = 0;
    auStack_3ec0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ec0._8_8_ = 0;
    auStack_3ec0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ec0[0x18] = 0;
    local_3e70[0] = 0;
    local_3e90._16_8_ = 0;
    local_3e90._24_8_ = 0;
    local_3e90._0_8_ = 0;
    local_3e90._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ea0._0_8_ = 0;
    local_3ea0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3e50[8] = 0;
    auStack_3e60._8_8_ = 0;
    auStack_3e50._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e70._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3e60._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e20._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e20._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e40._16_8_ = 0;
    local_3e40._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e40._0_8_ = 0;
    local_3e40._8_8_ = 0;
    local_3e10._0_2_ = 0;
    auStack_3dd8[8] = 0;
    local_3df0._16_8_ = 0;
    auStack_3dd8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3df0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3df0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e00._0_8_ = 0;
    local_3e00._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3db8[0x10] = 0;
    local_3db8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3db8._8_8_ = 0;
    local_3dc8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3dc8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d90[0x10] = 0;
    local_3d90._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d90._8_8_ = 0;
    local_3da0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3da0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d58[0] = 0;
    local_3d68._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d68._8_8_ = 0;
    local_3d78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d38[8] = 0;
    auStack_3d48._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d38._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d58._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d48._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d08[0x10] = 0;
    local_3d08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d08._8_8_ = 0;
    local_3d18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d28._0_8_ = 0;
    local_3d28._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cd0[0] = 0;
    local_3ce0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ce0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cf0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cf0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ca8[0] = 0;
    auStack_3cc0._8_8_ = 0;
    auStack_3cc0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cd0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3cc0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3c58._0_8_ = (_Base_ptr)0x0;
    local_3c38._0_8_ = (long)local_3c58 + 0x10;
    local_3c58._16_4_ = _S_red;
    local_3c58._24_8_ = (_Base_ptr)0x0;
    auStack_3c08[0x10] = 0;
    auStack_3c08._17_8_ = 0;
    auStack_3c08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c08[8] = 0;
    auStack_3c08._9_7_ = 0;
    local_3c18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3c18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3c38._16_8_ = (pointer)0x0;
    local_3c38._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3bd0[8] = false;
    local_3be8._16_8_ = 0;
    auStack_3bd0._0_8_ = 0;
    local_3be8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3be8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    sStack_3bc0._16_1_ = 0;
    sStack_3bc0._17_8_ = 0;
    sStack_3bc0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    sStack_3bc0._8_1_ = 0;
    sStack_3bc0._9_7_ = 0;
    local_3b60._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3b60._0_8_ = 0;
    local_3b60._8_8_ = (pointer)0x0;
    local_3b30._0_8_ = local_3b40;
    local_3b40._0_4_ = 0;
    local_3b40._8_8_ = 0;
    auStack_3ba0._16_4_ = 0;
    auStack_3ba0._20_8_ = 0;
    auStack_3ba0[0] = false;
    auStack_3ba0._1_3_ = 0;
    auStack_3ba0._4_4_ = (storage_t<unsigned_int>)0x0;
    auStack_3ba0._8_4_ = 0;
    auStack_3ba0._12_4_ = 0;
    auStack_3b78._8_4_ = 0;
    auStack_3b78._12_8_ = 0;
    auStack_3ba0._32_8_ = 0;
    auStack_3b78._0_4_ = 0;
    auStack_3b78._4_4_ = 0;
    local_3af0[0].data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3b08._8_8_ = 0;
    auStack_3b08._16_8_ = 0;
    auStack_3b18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3b08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3b30._16_8_ = 0;
    auStack_3b18._0_8_ = (storage_t<double>)0x0;
    local_41e8._464_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
    local_41e8._472_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
    local_3fe0._0_8_ = local_4008._32_8_;
    local_3c78._24_8_ = local_3c78._16_8_;
    local_3c38._8_8_ = local_3c38._0_8_;
    local_3b30._8_8_ = local_3b30._0_8_;
    bVar8 = ReconstructPrim<tinyusdz::Model>
                      (this,&spec,(Node *)local_4d28._24_8_,psmap,(Model *)local_49a8);
    if (!bVar8) {
      this_00 = (ostringstream *)local_4cf8;
      ::std::__cxx11::ostringstream::ostringstream(this_00);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"ReconstructPrimFromTypeName",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<(this_00,0x70b);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Failed to reconstruct Model",0x1b);
LAB_001876db:
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_4d38);
      poVar13 = local_4d08;
      if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
        operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      poVar13->has_value_ = false;
      memset(&poVar13->contained,0,0x350);
      goto LAB_001878bf;
    }
    PrimMetas::operator=((PrimMetas *)local_3f80,meta);
    ::std::__cxx11::string::_M_assign((string *)local_3fd0);
    iVar9 = ::std::__cxx11::string::compare((char *)local_4d00);
    poVar13 = local_4d08;
    if (iVar9 == 0) {
      ::std::__cxx11::string::_M_replace((ulong)&local_3fb0,0,(char *)local_3fa8,0x5f3bf3);
    }
    else {
      ::std::__cxx11::string::_M_assign((string *)&local_3fb0);
    }
    local_3f90._0_4_ = spec;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(auStack_3b08 + 8),
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
    pvVar6 = primChildren;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)auStack_3b18,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
    local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::Model>()::table;
    pGVar10 = (GeomMesh *)operator_new(0xec0);
    Model::Model((Model *)pGVar10,(Model *)local_49a8);
    local_4d38.dynamic = pGVar10;
    Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
    ::std::__cxx11::string::_M_assign(local_4a88);
    pPVar11 = Prim::metas((Prim *)local_4cf8);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              (&pPVar11->primChildren,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
LAB_00187894:
    poVar13->has_value_ = true;
    Prim::Prim((Prim *)&poVar13->contained,(Prim *)local_4cf8);
    Prim::~Prim((Prim *)local_4cf8);
    if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
      (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
    }
LAB_001878bf:
    Model::~Model((Model *)local_49a8);
    return poVar13;
  }
  local_49a8._0_8_ = &local_4998;
  local_4998._M_allocated_capacity._0_4_ = 0x726f6658;
  local_4998._M_local_buf[4] = 'm';
  local_4998._M_local_buf[5] = '\0';
  local_49a8._8_8_ = (pointer)0x5;
  sVar1 = typeName->_M_string_length;
  if (sVar1 == 5) {
    piVar2 = (int *)(typeName->_M_dataplus)._M_p;
    if ((char)piVar2[1] == 'm' && *piVar2 == 0x726f6658) {
      GPrim::GPrim((GPrim *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::Xform>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(Xform *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f10._0_4_ = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200),
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::Xform>()::table;
        pGVar10 = (GeomMesh *)operator_new(0x1e68);
        GPrim::GPrim((GPrim *)pGVar10,(GPrim *)local_49a8);
        local_4d38.dynamic = pGVar10;
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x720);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GPrim::~GPrim((GPrim *)local_49a8);
      return __return_storage_ptr__;
    }
    piVar2 = (int *)(typeName->_M_dataplus)._M_p;
    if ((char)piVar2[1] == 'l' && *piVar2 == 0x65646f4d) {
      local_4978._0_8_ = local_4988;
      local_49a8._0_8_ = (pointer)0x0;
      local_49a8._8_8_ = (pointer)0x0;
      local_4998._M_allocated_capacity._0_4_ = 0;
      local_4998._M_local_buf[4] = '\0';
      local_4998._M_local_buf[5] = '\0';
      local_4998._M_local_buf[6] = '\0';
      local_4998._M_local_buf[7] = '\0';
      local_4988._0_4_ = _S_red;
      local_4988._8_8_ = (_Base_ptr)0x0;
      local_4978._16_8_ = 0;
      local_4978[0x18] = false;
      local_4978._8_8_ = local_4978._0_8_;
      memset(local_4338,0,0x308);
      local_41e8._448_4_ = _S_red;
      local_41e8._456_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      memset(local_4958,0,0x309);
      memset(local_4648,0,0x309);
      local_4008._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_4008._32_8_ = (long)local_4008 + 0x10;
      local_4008._16_4_ = _S_red;
      local_4008._24_8_ = (_Base_ptr)0x0;
      local_3fe0._8_8_ = 0;
      local_3fd0._0_8_ = local_3fc0;
      local_3fd0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3fc0[0] = '\0';
      _local_3fb0 = &local_3fa0;
      local_3fa8 = (char *)0x0;
      local_3fa0._M_local_buf[0] = false;
      local_3f90._0_4_ = Def;
      local_3f90._8_8_ = (anon_struct_8_0_00000001_for___align)0xffffffffffffffff;
      local_3f80._8_4_ = 0;
      local_3f80._16_8_ = local_3f60;
      local_3f80._0_4_ = 0;
      local_3f80[4] = '\0';
      local_3f80._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3f60[0] = '\0';
      local_3f60[0x10] = 0;
      local_3e10[8] = 0;
      local_3ca8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3c98._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3c98._8_8_ = (_Base_ptr)0x0;
      auStack_3c98._16_8_ = (_Base_ptr)0x0;
      local_3c78._16_8_ = local_3c78;
      local_3c78._0_4_ = _S_red;
      local_3c78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3f60._24_8_ = 0;
      local_3f60._32_8_ = 0;
      local_3f38 = (undefined1  [8])0x0;
      auStack_3f30._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3f30._8_8_ = 0;
      auStack_3f30._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3f30[0x18] = 0;
      local_3f10._0_8_ = 0;
      local_3f10._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3f00._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3f00._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3ef0._M_allocated_capacity = 0;
      local_3ef0._8_8_ = 0;
      local_3ee0 = 0;
      local_3ed8._0_8_ = 0;
      local_3ed8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3ed8._16_8_ = 0;
      auStack_3ec0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3ec0._8_8_ = 0;
      auStack_3ec0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3ec0[0x18] = 0;
      local_3e70[0] = 0;
      local_3e90._16_8_ = 0;
      local_3e90._24_8_ = 0;
      local_3e90._0_8_ = 0;
      local_3e90._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3ea0._0_8_ = 0;
      local_3ea0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3e50[8] = 0;
      auStack_3e60._8_8_ = 0;
      auStack_3e50._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e70._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3e60._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e20._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e20._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e40._16_8_ = 0;
      local_3e40._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e40._0_8_ = 0;
      local_3e40._8_8_ = 0;
      local_3e10._0_2_ = 0;
      auStack_3dd8[8] = 0;
      local_3df0._16_8_ = 0;
      auStack_3dd8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3df0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3df0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e00._0_8_ = 0;
      local_3e00._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3db8[0x10] = 0;
      local_3db8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3db8._8_8_ = 0;
      local_3dc8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3dc8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d90[0x10] = 0;
      local_3d90._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d90._8_8_ = 0;
      local_3da0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3da0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d58[0] = 0;
      local_3d68._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d68._8_8_ = 0;
      local_3d78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3d38[8] = 0;
      auStack_3d48._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3d38._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d58._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3d48._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d08[0x10] = 0;
      local_3d08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d08._8_8_ = 0;
      local_3d18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d28._0_8_ = 0;
      local_3d28._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3cd0[0] = 0;
      local_3ce0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3ce0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3cf0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3cf0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3ca8[0] = 0;
      auStack_3cc0._8_8_ = 0;
      auStack_3cc0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3cd0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3cc0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3c58._0_8_ = (_Base_ptr)0x0;
      local_3c38._0_8_ = (long)local_3c58 + 0x10;
      local_3c58._16_4_ = _S_red;
      local_3c58._24_8_ = (_Base_ptr)0x0;
      auStack_3c08[0x10] = 0;
      auStack_3c08._17_8_ = 0;
      auStack_3c08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3c08[8] = 0;
      auStack_3c08._9_7_ = 0;
      local_3c18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3c18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3c38._16_8_ = (pointer)0x0;
      local_3c38._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3bd0[8] = false;
      local_3be8._16_8_ = 0;
      auStack_3bd0._0_8_ = 0;
      local_3be8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3be8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      sStack_3bc0._16_1_ = 0;
      sStack_3bc0._17_8_ = 0;
      sStack_3bc0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      sStack_3bc0._8_1_ = 0;
      sStack_3bc0._9_7_ = 0;
      local_3b60._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3b60._0_8_ = 0;
      local_3b60._8_8_ = (pointer)0x0;
      local_3b30._0_8_ = local_3b40;
      local_3b40._0_4_ = 0;
      local_3b40._8_8_ = 0;
      auStack_3ba0._16_4_ = 0;
      auStack_3ba0._20_8_ = 0;
      auStack_3ba0[0] = false;
      auStack_3ba0._1_3_ = 0;
      auStack_3ba0._4_4_ = (storage_t<unsigned_int>)0x0;
      auStack_3ba0._8_4_ = 0;
      auStack_3ba0._12_4_ = 0;
      auStack_3b78._8_4_ = 0;
      auStack_3b78._12_8_ = 0;
      auStack_3ba0._32_8_ = 0;
      auStack_3b78._0_4_ = 0;
      auStack_3b78._4_4_ = 0;
      local_3af0[0].data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3b08._8_8_ = 0;
      auStack_3b08._16_8_ = 0;
      auStack_3b18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3b08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3b30._16_8_ = 0;
      auStack_3b18._0_8_ = (storage_t<double>)0x0;
      local_41e8._464_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
      local_41e8._472_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
      local_3fe0._0_8_ = local_4008._32_8_;
      local_3c78._24_8_ = local_3c78._16_8_;
      local_3c38._8_8_ = local_3c38._0_8_;
      local_3b30._8_8_ = local_3b30._0_8_;
      bVar8 = ReconstructPrim<tinyusdz::Model>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(Model *)local_49a8);
      if (!bVar8) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x721);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(local_4d00->_M_dataplus)._M_p,
                             local_4d00->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        this_00 = (ostringstream *)
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        goto LAB_001876db;
      }
      PrimMetas::operator=((PrimMetas *)local_3f80,meta);
      ::std::__cxx11::string::_M_assign((string *)local_3fd0);
      local_3f90._0_4_ = spec;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(auStack_3b08 + 8),
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
      pvVar6 = primChildren;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)auStack_3b18,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
      local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::Model>()::table;
      pGVar10 = (GeomMesh *)operator_new(0xec0);
      Model::Model((Model *)pGVar10,(Model *)local_49a8);
      local_4d38.dynamic = pGVar10;
      Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
      ::std::__cxx11::string::_M_assign(local_4a88);
      pPVar11 = Prim::metas((Prim *)local_4cf8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&pPVar11->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      poVar13 = local_4d08;
      goto LAB_00187894;
    }
    local_4998._M_allocated_capacity._0_4_ = 0x706f6353;
    local_4998._M_local_buf[4] = 'e';
    local_4998._M_local_buf[5] = '\0';
    local_49a8._8_8_ = (pointer)0x5;
    piVar2 = (int *)(typeName->_M_dataplus)._M_p;
    if ((char)piVar2[1] == 'e' && *piVar2 == 0x706f6353) {
      Scope::Scope((Scope *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::Scope>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(Scope *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)&local_3fa0,meta);
        ::std::__cxx11::string::_M_assign((string *)local_3fd0);
        local_3fb0 = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_38a0,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&local_38b8,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::Scope>()::table;
        pGVar10 = (GeomMesh *)operator_new(0x1120);
        Scope::Scope((Scope *)pGVar10,(Scope *)local_49a8);
        local_4d38.dynamic = pGVar10;
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x722);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      Scope::~Scope((Scope *)local_49a8);
      return __return_storage_ptr__;
    }
LAB_00187799:
    local_4998._M_local_buf[5] = '\0';
    local_4998._M_allocated_capacity._0_4_ = 0x65627543;
    local_49a8._8_8_ = (pointer)0x4;
    local_4998._M_local_buf[4] = '\0';
    if (sVar1 == 5) {
      bVar8 = false;
      goto LAB_00187c78;
    }
    if (*(int *)(typeName->_M_dataplus)._M_p == 0x65627543) {
      GeomCube::GeomCube((GeomCube *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::GeomCube>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(GeomCube *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f10._0_4_ = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200),
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCube>()::table;
        linb::any::do_construct<tinyusdz::GeomCube_const&,tinyusdz::GeomCube>
                  ((any *)&local_4d38,(GeomCube *)local_49a8);
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x726);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomCube::~GeomCube((GeomCube *)local_49a8);
      return __return_storage_ptr__;
    }
    local_4998._M_allocated_capacity._0_4_ = 0x656e6f43;
    local_49a8._8_8_ = (pointer)0x4;
    local_4998._M_local_buf[4] = '\0';
    if (*(int *)(typeName->_M_dataplus)._M_p == 0x656e6f43) {
      GeomCone::GeomCone((GeomCone *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::GeomCone>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(GeomCone *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f10._0_4_ = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200),
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCone>()::table;
        pGVar10 = (GeomMesh *)operator_new(0x25d0);
        GeomCone::GeomCone((GeomCone *)pGVar10,(GeomCone *)local_49a8);
        local_4d38.dynamic = pGVar10;
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x727);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomCone::~GeomCone((GeomCone *)local_49a8);
      return __return_storage_ptr__;
    }
    bVar5 = false;
LAB_00187dfe:
    bVar8 = false;
  }
  else {
    local_4998._M_allocated_capacity._0_4_ = 0x6873654d;
    local_49a8._8_8_ = (pointer)0x4;
    local_4998._M_local_buf[4] = '\0';
    if (sVar1 == 4) {
      if (*(int *)(typeName->_M_dataplus)._M_p == 0x6873654d) {
        GeomMesh::GeomMesh((GeomMesh *)local_49a8);
        bVar8 = ReconstructPrim<tinyusdz::GeomMesh>
                          (this,&spec,(Node *)local_4d28._24_8_,psmap,(GeomMesh *)local_49a8);
        if (bVar8) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          local_3f10._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6)
          ;
          pvVar6 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomMesh>()::table;
          pGVar10 = (GeomMesh *)operator_new(0x4978);
          GeomMesh::GeomMesh(pGVar10,(GeomMesh *)local_49a8);
          local_4d38.dynamic = pGVar10;
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar11 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar11->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x723);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                               typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d38);
          if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
            operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomMesh::~GeomMesh((GeomMesh *)local_49a8);
        return __return_storage_ptr__;
      }
      goto LAB_00187799;
    }
    local_4998._M_allocated_capacity._0_4_ = 0x6e696f50;
    local_4998._M_local_buf[4] = 't';
    local_4998._M_local_buf[5] = 's';
    local_49a8._8_8_ = (pointer)0x6;
    local_4998._M_local_buf[6] = '\0';
    bVar8 = sVar1 == 6;
    if (bVar8) {
      piVar2 = (int *)(typeName->_M_dataplus)._M_p;
      if ((short)piVar2[1] == 0x7374 && *piVar2 == 0x6e696f50) {
        GeomPoints::GeomPoints((GeomPoints *)local_49a8);
        bVar8 = ReconstructPrim<tinyusdz::GeomPoints>
                          (this,&spec,(Node *)local_4d28._24_8_,psmap,(GeomPoints *)local_49a8);
        if (bVar8) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          local_3f10._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6)
          ;
          pvVar6 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomPoints>()::table;
          pGVar10 = (GeomMesh *)operator_new(0x2d38);
          GeomPoints::GeomPoints((GeomPoints *)pGVar10,(GeomPoints *)local_49a8);
          local_4d38.dynamic = pGVar10;
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar11 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar11->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x724);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                               typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d38);
          if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
            operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomPoints::~GeomPoints((GeomPoints *)local_49a8);
        return __return_storage_ptr__;
      }
LAB_00187c78:
      bVar5 = false;
    }
    else {
      local_4998._M_allocated_capacity._0_4_ = 0x696c7943;
      local_4998._M_local_buf[4] = 'n';
      local_4998._M_local_buf[5] = 'd';
      local_4998._M_local_buf[6] = 'e';
      local_4998._M_local_buf[7] = 'r';
      local_49a8._8_8_ = (pointer)0x8;
      local_4998._M_local_buf[8] = '\0';
      if (sVar1 != 8) goto LAB_00187c78;
      if (*(long *)(typeName->_M_dataplus)._M_p == 0x7265646e696c7943) {
        GeomCylinder::GeomCylinder((GeomCylinder *)local_49a8);
        bVar8 = ReconstructPrim<tinyusdz::GeomCylinder>
                          (this,&spec,(Node *)local_4d28._24_8_,psmap,(GeomCylinder *)local_49a8);
        if (bVar8) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          local_3f10._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6)
          ;
          pvVar6 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCylinder>()::table;
          pGVar10 = (GeomMesh *)operator_new(0x25d0);
          GeomCylinder::GeomCylinder((GeomCylinder *)pGVar10,(GeomCylinder *)local_49a8);
          local_4d38.dynamic = pGVar10;
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar11 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar11->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x725);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                               typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d38);
          if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
            operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCylinder::~GeomCylinder((GeomCylinder *)local_49a8);
        return __return_storage_ptr__;
      }
      bVar5 = true;
      bVar8 = false;
    }
    local_4998._M_allocated_capacity._0_4_ = 0x65687053;
    local_4998._M_local_buf[4] = 'r';
    local_4998._M_local_buf[5] = 'e';
    local_49a8._8_8_ = (pointer)0x6;
    local_4998._M_local_buf[6] = '\0';
    if (!bVar8) goto LAB_00187dfe;
    piVar2 = (int *)(typeName->_M_dataplus)._M_p;
    bVar8 = true;
    if ((short)piVar2[1] == 0x6572 && *piVar2 == 0x65687053) {
      GeomSphere::GeomSphere((GeomSphere *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::GeomSphere>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(GeomSphere *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f10._0_4_ = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200),
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomSphere>()::table;
        linb::any::do_construct<tinyusdz::GeomSphere_const&,tinyusdz::GeomSphere>
                  ((any *)&local_4d38,(GeomSphere *)local_49a8);
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x728);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomSphere::~GeomSphere((GeomSphere *)local_49a8);
      return __return_storage_ptr__;
    }
  }
  local_4998._M_allocated_capacity._0_4_ = 0x73706143;
  local_4998._M_local_buf[4] = 'u';
  local_4998._M_local_buf[5] = 'l';
  local_4998._M_local_buf[6] = 'e';
  local_49a8._8_8_ = (pointer)0x7;
  local_4998._M_local_buf[7] = '\0';
  if (sVar1 == 7) {
    piVar2 = (int *)(typeName->_M_dataplus)._M_p;
    if (*(int *)((long)piVar2 + 3) == 0x656c7573 && *piVar2 == 0x73706143) {
      GeomCapsule::GeomCapsule((GeomCapsule *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::GeomCapsule>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(GeomCapsule *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f10._0_4_ = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200),
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCapsule>()::table;
        pGVar10 = (GeomMesh *)operator_new(0x25d0);
        GeomCapsule::GeomCapsule((GeomCapsule *)pGVar10,(GeomCapsule *)local_49a8);
        local_4d38.dynamic = pGVar10;
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x729);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomCapsule::~GeomCapsule((GeomCapsule *)local_49a8);
      return __return_storage_ptr__;
    }
LAB_0018875c:
    bVar4 = false;
  }
  else {
    local_4998._M_allocated_capacity._0_4_ = 0x69736142;
    local_4998._M_local_buf[4] = 's';
    local_4998._M_local_buf[5] = 'C';
    local_4998._M_local_buf[6] = 'u';
    local_4998._M_local_buf[7] = 'r';
    local_4998._M_local_buf[8] = 'v';
    local_4998._M_local_buf[9] = 'e';
    local_4998._M_local_buf[10] = 's';
    local_49a8._8_8_ = (pointer)0xb;
    local_4998._M_local_buf[0xb] = '\0';
    if (sVar1 != 0xb) {
      local_4998._M_allocated_capacity._0_4_ = 0x6e696f50;
      local_4998._M_local_buf[4] = 't';
      local_4998._M_local_buf[5] = 'I';
      local_4998._M_local_buf[6] = 'n';
      local_4998._M_local_buf[7] = 's';
      local_4998._M_local_buf[8] = 't';
      local_4998._M_local_buf[9] = 'a';
      local_4998._M_local_buf[10] = 'n';
      local_4998._M_local_buf[0xb] = 'c';
      local_4998._M_local_buf[0xc] = 'e';
      local_4998._M_local_buf[0xd] = 'r';
      local_49a8._8_8_ = (pointer)0xe;
      local_4998._M_local_buf[0xe] = '\0';
      if ((sVar1 == 0xe) &&
         (plVar3 = (long *)(typeName->_M_dataplus)._M_p,
         *(long *)((long)plVar3 + 6) == 0x7265636e6174736e && *plVar3 == 0x736e49746e696f50)) {
        PointInstancer::PointInstancer((PointInstancer *)local_49a8);
        bVar8 = ReconstructPrim<tinyusdz::PointInstancer>
                          (this,&spec,(Node *)local_4d28._24_8_,psmap,(PointInstancer *)local_49a8);
        if (bVar8) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          local_3f10._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6)
          ;
          pvVar6 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::PointInstancer>()::table;
          pGVar10 = (GeomMesh *)operator_new(0x37b0);
          PointInstancer::PointInstancer((PointInstancer *)pGVar10,(PointInstancer *)local_49a8);
          local_4d38.dynamic = pGVar10;
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar11 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar11->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                               typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d38);
          if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
            operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        PointInstancer::~PointInstancer((PointInstancer *)local_49a8);
        return __return_storage_ptr__;
      }
      goto LAB_0018875c;
    }
    plVar3 = (long *)(typeName->_M_dataplus)._M_p;
    if (*(long *)((long)plVar3 + 3) == 0x7365767275437369 && *plVar3 == 0x7275437369736142) {
      GeomBasisCurves::GeomBasisCurves((GeomBasisCurves *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::GeomBasisCurves>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(GeomBasisCurves *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f10._0_4_ = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200),
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomBasisCurves>()::table;
        pGVar10 = (GeomMesh *)operator_new(0x33e0);
        GeomBasisCurves::GeomBasisCurves((GeomBasisCurves *)pGVar10,(GeomBasisCurves *)local_49a8);
        local_4d38.dynamic = pGVar10;
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72a);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomBasisCurves::~GeomBasisCurves((GeomBasisCurves *)local_49a8);
      return __return_storage_ptr__;
    }
    local_4998._M_allocated_capacity._0_4_ = 0x6272754e;
    local_4998._M_local_buf[4] = 's';
    local_4998._M_local_buf[5] = 'C';
    local_4998._M_local_buf[6] = 'u';
    local_4998._M_local_buf[7] = 'r';
    local_4998._M_local_buf[8] = 'v';
    local_4998._M_local_buf[9] = 'e';
    local_4998._M_local_buf[10] = 's';
    local_49a8._8_8_ = (pointer)0xb;
    local_4998._M_local_buf[0xb] = '\0';
    plVar3 = (long *)(typeName->_M_dataplus)._M_p;
    if (*(long *)((long)plVar3 + 3) == 0x7365767275437362 && *plVar3 == 0x727543736272754e) {
      GeomNurbsCurves::GeomNurbsCurves((GeomNurbsCurves *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::GeomNurbsCurves>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(GeomNurbsCurves *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f10._0_4_ = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200),
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomNurbsCurves>()::table;
        pGVar10 = (GeomMesh *)operator_new(0x3718);
        GeomNurbsCurves::GeomNurbsCurves((GeomNurbsCurves *)pGVar10,(GeomNurbsCurves *)local_49a8);
        local_4d38.dynamic = pGVar10;
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72b);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomNurbsCurves::~GeomNurbsCurves((GeomNurbsCurves *)local_49a8);
      return __return_storage_ptr__;
    }
    bVar4 = true;
  }
  local_4998._M_allocated_capacity._0_4_ = 0x656d6143;
  local_4998._M_local_buf[4] = 'r';
  local_4998._M_local_buf[5] = 'a';
  local_49a8._8_8_ = (pointer)0x6;
  local_4998._M_local_buf[6] = '\0';
  if ((bVar8) &&
     (piVar2 = (int *)(typeName->_M_dataplus)._M_p,
     (short)piVar2[1] == 0x6172 && *piVar2 == 0x656d6143)) {
    GeomCamera::GeomCamera((GeomCamera *)local_49a8);
    bVar8 = ReconstructPrim<tinyusdz::GeomCamera>
                      (this,&spec,(Node *)local_4d28._24_8_,psmap,(GeomCamera *)local_49a8);
    if (bVar8) {
      PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
      ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
      local_3f10._0_4_ = spec;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (local_2b88,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      pvVar6 = primChildren;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200),
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
      local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCamera>()::table;
      pGVar10 = (GeomMesh *)operator_new(0x41a8);
      GeomCamera::GeomCamera((GeomCamera *)pGVar10,(GeomCamera *)local_49a8);
      local_4d38.dynamic = pGVar10;
      Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
      ::std::__cxx11::string::_M_assign(local_4a88);
      pPVar11 = Prim::metas((Prim *)local_4cf8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&pPVar11->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      __return_storage_ptr__->has_value_ = true;
      Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
      Prim::~Prim((Prim *)local_4cf8);
      if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
        (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                           typeName->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_4d38);
      if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
        operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
    }
    GeomCamera::~GeomCamera((GeomCamera *)local_49a8);
    return __return_storage_ptr__;
  }
  local_4998._M_allocated_capacity._0_4_ = 0x6d6f6547;
  local_4998._M_local_buf[4] = 'S';
  local_4998._M_local_buf[5] = 'u';
  local_4998._M_local_buf[6] = 'b';
  local_4998._M_local_buf[7] = 's';
  local_4998._M_local_buf[8] = 'e';
  local_4998._M_local_buf[9] = 't';
  local_49a8._8_8_ = (pointer)0xa;
  local_4998._M_local_buf[10] = '\0';
  if ((sVar1 == 10) &&
     (plVar3 = (long *)(typeName->_M_dataplus)._M_p,
     (short)plVar3[1] == 0x7465 && *plVar3 == 0x736275536d6f6547)) {
    GeomSubset::GeomSubset((GeomSubset *)local_49a8);
    bVar8 = ReconstructPrim<tinyusdz::GeomSubset>
                      (this,&spec,(Node *)local_4d28._24_8_,psmap,(GeomSubset *)local_49a8);
    if (bVar8) {
      PrimMetas::operator=((PrimMetas *)local_3868,meta);
      ::std::__cxx11::string::_M_assign((string *)local_3fd0);
      local_3fb0 = spec;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (local_3458,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      pvVar6 = primChildren;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&local_3470,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
      local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomSubset>()::table;
      pGVar10 = (GeomMesh *)operator_new(0x1568);
      GeomSubset::GeomSubset((GeomSubset *)pGVar10,(GeomSubset *)local_49a8);
      local_4d38.dynamic = pGVar10;
      Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
      ::std::__cxx11::string::_M_assign(local_4a88);
      pPVar11 = Prim::metas((Prim *)local_4cf8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&pPVar11->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      __return_storage_ptr__->has_value_ = true;
      Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
      Prim::~Prim((Prim *)local_4cf8);
      if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
        (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72e);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                           typeName->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_4d38);
      if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
        operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
    }
    GeomSubset::~GeomSubset((GeomSubset *)local_49a8);
    return __return_storage_ptr__;
  }
  local_4998._M_allocated_capacity._0_4_ = 0x65687053;
  local_4998._M_local_buf[4] = 'r';
  local_4998._M_local_buf[5] = 'e';
  local_4998._M_local_buf[6] = 'L';
  local_4998._M_local_buf[7] = 'i';
  local_4998._M_local_buf[8] = 'g';
  local_4998._M_local_buf[9] = 'h';
  local_4998._M_local_buf[10] = 't';
  local_49a8._8_8_ = (pointer)0xb;
  local_4998._M_local_buf[0xb] = '\0';
  if ((bVar4) &&
     (plVar3 = (long *)(typeName->_M_dataplus)._M_p,
     *(long *)((long)plVar3 + 3) == 0x746867694c657265 && *plVar3 == 0x694c657265687053)) {
    SphereLight::SphereLight((SphereLight *)local_49a8);
    bVar8 = ReconstructPrim<tinyusdz::SphereLight>
                      (this,&spec,(Node *)local_4d28._24_8_,psmap,(SphereLight *)local_49a8);
    if (bVar8) {
      PrimMetas::operator=((PrimMetas *)local_2c68,meta);
      ::std::__cxx11::string::_M_assign(local_48c0);
      local_48c0[0x20] = (string)(undefined1)spec;
      local_48c0[0x21] = (string)spec._1_1_;
      local_48c0[0x22] = (string)spec._2_1_;
      local_48c0[0x23] = (string)spec._3_1_;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (local_2858,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      pvVar6 = primChildren;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&local_2870,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
      local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::SphereLight>()::table;
      linb::any::do_construct<tinyusdz::SphereLight_const&,tinyusdz::SphereLight>
                ((any *)&local_4d38,(SphereLight *)local_49a8);
      Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
      ::std::__cxx11::string::_M_assign(local_4a88);
      pPVar11 = Prim::metas((Prim *)local_4cf8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&pPVar11->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      __return_storage_ptr__->has_value_ = true;
      Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
      Prim::~Prim((Prim *)local_4cf8);
      if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
        (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                           typeName->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_4d38);
      if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
        operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
    }
    SphereLight::~SphereLight((SphereLight *)local_49a8);
    return __return_storage_ptr__;
  }
  local_4998._M_allocated_capacity._0_4_ = 0x656d6f44;
  local_4998._M_local_buf[4] = 'L';
  local_4998._M_local_buf[5] = 'i';
  local_4998._M_local_buf[6] = 'g';
  local_4998._M_local_buf[7] = 'h';
  local_4998._M_local_buf[8] = 't';
  local_4998._M_local_buf[9] = '\0';
  local_49a8._8_8_ = (pointer)0x9;
  if (sVar1 == 9) {
    plVar3 = (long *)(typeName->_M_dataplus)._M_p;
    if ((char)plVar3[1] == 't' && *plVar3 == 0x6867694c656d6f44) {
      DomeLight::DomeLight((DomeLight *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::DomeLight>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(DomeLight *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)local_2ee0,meta);
        ::std::__cxx11::string::_M_assign(local_48c0);
        local_48c0[0x20] = (string)(undefined1)spec;
        local_48c0[0x21] = (string)spec._1_1_;
        local_48c0[0x22] = (string)spec._2_1_;
        local_48c0[0x23] = (string)spec._3_1_;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2ad0,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&local_2ae8,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::DomeLight>()::table;
        pGVar10 = (GeomMesh *)operator_new(0x26a0);
        DomeLight::DomeLight((DomeLight *)pGVar10,(DomeLight *)local_49a8);
        local_4d38.dynamic = pGVar10;
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x730);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      DomeLight::~DomeLight((DomeLight *)local_49a8);
      return __return_storage_ptr__;
    }
    local_4998._M_allocated_capacity._0_4_ = 0x6b736944;
    local_4998._M_local_buf[4] = 'L';
    local_4998._M_local_buf[5] = 'i';
    local_4998._M_local_buf[6] = 'g';
    local_4998._M_local_buf[7] = 'h';
    local_4998._M_local_buf[8] = 't';
    local_4998._M_local_buf[9] = '\0';
    local_49a8._8_8_ = (pointer)0x9;
    plVar3 = (long *)(typeName->_M_dataplus)._M_p;
    if ((char)plVar3[1] == 't' && *plVar3 == 0x6867694c6b736944) {
      DiskLight::DiskLight((DiskLight *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::DiskLight>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(DiskLight *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)local_2c68,meta);
        ::std::__cxx11::string::_M_assign(local_48c0);
        local_48c0[0x20] = (string)(undefined1)spec;
        local_48c0[0x21] = (string)spec._1_1_;
        local_48c0[0x22] = (string)spec._2_1_;
        local_48c0[0x23] = (string)spec._3_1_;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2858,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&local_2870,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::DiskLight>()::table;
        linb::any::do_construct<tinyusdz::DiskLight_const&,tinyusdz::DiskLight>
                  ((any *)&local_4d38,(DiskLight *)local_49a8);
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x732);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      DiskLight::~DiskLight((DiskLight *)local_49a8);
      return __return_storage_ptr__;
    }
  }
  else {
    local_4998._M_allocated_capacity._0_4_ = 0x696c7943;
    local_4998._M_local_buf[4] = 'n';
    local_4998._M_local_buf[5] = 'd';
    local_4998._M_local_buf[6] = 'e';
    local_4998._M_local_buf[7] = 'r';
    local_4998._M_local_buf[8] = 'L';
    local_4998._M_local_buf[9] = 'i';
    local_4998._M_local_buf[10] = 'g';
    local_4998._M_local_buf[0xb] = 'h';
    local_4998._M_local_buf[0xc] = 't';
    local_49a8._8_8_ = (pointer)0xd;
    local_4998._M_local_buf[0xd] = '\0';
    if (sVar1 == 0xd) {
      plVar3 = (long *)(typeName->_M_dataplus)._M_p;
      if (*(long *)((long)plVar3 + 5) == 0x746867694c726564 && *plVar3 == 0x7265646e696c7943) {
        CylinderLight::CylinderLight((CylinderLight *)local_49a8);
        bVar8 = ReconstructPrim<tinyusdz::CylinderLight>
                          (this,&spec,(Node *)local_4d28._24_8_,psmap,(CylinderLight *)local_49a8);
        if (bVar8) {
          PrimMetas::operator=((PrimMetas *)local_2c68,meta);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0[0x20] = (string)(undefined1)spec;
          local_48c0[0x21] = (string)spec._1_1_;
          local_48c0[0x22] = (string)spec._2_1_;
          local_48c0[0x23] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2858,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6)
          ;
          pvVar6 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_2870,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::CylinderLight>()::table;
          pGVar10 = (GeomMesh *)operator_new(0x2678);
          CylinderLight::CylinderLight((CylinderLight *)pGVar10,(CylinderLight *)local_49a8);
          local_4d38.dynamic = pGVar10;
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar11 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar11->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x731);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                               typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d38);
          if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
            operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        CylinderLight::~CylinderLight((CylinderLight *)local_49a8);
        return __return_storage_ptr__;
      }
      bVar4 = true;
      goto LAB_0018993f;
    }
    local_4998._M_allocated_capacity._0_4_ = 0x74736944;
    local_4998._M_local_buf[4] = 'a';
    local_4998._M_local_buf[5] = 'n';
    local_4998._M_local_buf[6] = 't';
    local_4998._M_local_buf[7] = 'L';
    local_4998._M_local_buf[8] = 'i';
    local_4998._M_local_buf[9] = 'g';
    local_4998._M_local_buf[10] = 'h';
    local_4998._M_local_buf[0xb] = 't';
    local_49a8._8_8_ = (pointer)0xc;
    local_4998._M_local_buf[0xc] = '\0';
    if ((sVar1 == 0xc) &&
       (plVar3 = (long *)(typeName->_M_dataplus)._M_p,
       (int)plVar3[1] == 0x74686769 && *plVar3 == 0x4c746e6174736944)) {
      DistantLight::DistantLight((DistantLight *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::DistantLight>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(DistantLight *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)local_2ee0,meta);
        ::std::__cxx11::string::_M_assign(local_48c0);
        local_48c0[0x20] = (string)(undefined1)spec;
        local_48c0[0x21] = (string)spec._1_1_;
        local_48c0[0x22] = (string)spec._2_1_;
        local_48c0[0x23] = (string)spec._3_1_;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2ad0,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&local_2ae8,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::DistantLight>()::table;
        linb::any::do_construct<tinyusdz::DistantLight_const&,tinyusdz::DistantLight>
                  ((any *)&local_4d38,(DistantLight *)local_49a8);
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x733);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      DistantLight::~DistantLight((DistantLight *)local_49a8);
      return __return_storage_ptr__;
    }
  }
  bVar4 = false;
LAB_0018993f:
  local_4998._M_allocated_capacity._0_4_ = 0x6c656b53;
  local_4998._M_local_buf[4] = 'R';
  local_4998._M_local_buf[5] = 'o';
  local_4998._M_local_buf[6] = 'o';
  local_4998._M_local_buf[7] = 't';
  local_49a8._8_8_ = (pointer)0x8;
  local_4998._M_local_buf[8] = '\0';
  if (bVar5) {
    if (*(long *)(typeName->_M_dataplus)._M_p == 0x746f6f526c656b53) {
      SkelRoot::SkelRoot((SkelRoot *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::SkelRoot>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(SkelRoot *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)local_3df0,meta);
        ::std::__cxx11::string::_M_assign(local_4908);
        local_48e8[0]._0_4_ = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_39e0,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_3a58 + 0x60),
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::SkelRoot>()::table;
        pGVar10 = (GeomMesh *)operator_new(0xfe0);
        SkelRoot::SkelRoot((SkelRoot *)pGVar10,(SkelRoot *)local_49a8);
        local_4d38.dynamic = pGVar10;
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x734);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      SkelRoot::~SkelRoot((SkelRoot *)local_49a8);
      return __return_storage_ptr__;
    }
    local_4998._M_allocated_capacity._0_4_ = 0x6c656b53;
    local_4998._M_local_buf[4] = 'e';
    local_4998._M_local_buf[5] = 't';
    local_4998._M_local_buf[6] = 'o';
    local_4998._M_local_buf[7] = 'n';
    local_49a8._8_8_ = (pointer)0x8;
    local_4998._M_local_buf[8] = '\0';
    if (*(long *)(typeName->_M_dataplus)._M_p == 0x6e6f74656c656b53) {
      Skeleton::Skeleton((Skeleton *)local_49a8);
      bVar8 = ReconstructPrim<tinyusdz::Skeleton>
                        (this,&spec,(Node *)local_4d28._24_8_,psmap,(Skeleton *)local_49a8);
      if (bVar8) {
        PrimMetas::operator=((PrimMetas *)local_31a0,meta);
        ::std::__cxx11::string::_M_assign(local_4908);
        local_48e8[0]._0_4_ = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2d90,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        pvVar6 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2ee0 + 0x138)
                   ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::Skeleton>()::table;
        pGVar10 = (GeomMesh *)operator_new(0x1c30);
        Skeleton::Skeleton((Skeleton *)pGVar10,(Skeleton *)local_49a8);
        local_4d38.dynamic = pGVar10;
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar11 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar11->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x735);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                             typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d38);
        if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
          operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      Skeleton::~Skeleton((Skeleton *)local_49a8);
      return __return_storage_ptr__;
    }
  }
  local_4998._M_allocated_capacity._0_4_ = 0x6c656b53;
  local_4998._M_local_buf[4] = 'A';
  local_4998._M_local_buf[5] = 'n';
  local_4998._M_local_buf[6] = 'i';
  local_4998._M_local_buf[7] = 'm';
  local_4998._M_local_buf[8] = 'a';
  local_4998._M_local_buf[9] = 't';
  local_4998._M_local_buf[10] = 'i';
  local_4998._M_local_buf[0xb] = 'o';
  local_4998._M_local_buf[0xc] = 'n';
  local_49a8._8_8_ = (pointer)0xd;
  local_4998._M_local_buf[0xd] = '\0';
  if ((bVar4) &&
     (plVar3 = (long *)(typeName->_M_dataplus)._M_p,
     *(long *)((long)plVar3 + 5) == 0x6e6f6974616d696e && *plVar3 == 0x6d696e416c656b53)) {
    SkelAnimation::SkelAnimation((SkelAnimation *)local_49a8);
    bVar8 = ReconstructPrim<tinyusdz::SkelAnimation>
                      (this,&spec,(Node *)local_4d28._24_8_,psmap,(SkelAnimation *)local_49a8);
    if (bVar8) {
      PrimMetas::operator=((PrimMetas *)local_3a58,meta);
      ::std::__cxx11::string::_M_assign((string *)local_49a8);
      local_4988._0_4_ = spec;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (local_3648,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      pvVar6 = primChildren;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_3868 + 0x208),
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
      local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::SkelAnimation>()::table;
      pGVar10 = (GeomMesh *)operator_new(0x1378);
      SkelAnimation::SkelAnimation((SkelAnimation *)pGVar10,(SkelAnimation *)local_49a8);
      local_4d38.dynamic = pGVar10;
      Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
      ::std::__cxx11::string::_M_assign(local_4a88);
      pPVar11 = Prim::metas((Prim *)local_4cf8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&pPVar11->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      __return_storage_ptr__->has_value_ = true;
      Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
      Prim::~Prim((Prim *)local_4cf8);
      if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
        (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x736);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                           typeName->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_4d38);
      if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
        operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
    }
    SkelAnimation::~SkelAnimation((SkelAnimation *)local_49a8);
    return __return_storage_ptr__;
  }
  local_4998._M_allocated_capacity._0_4_ = 0x6e656c42;
  local_4998._M_local_buf[4] = 'd';
  local_4998._M_local_buf[5] = 'S';
  local_4998._M_local_buf[6] = 'h';
  local_4998._M_local_buf[7] = 'a';
  local_4998._M_local_buf[8] = 'p';
  local_4998._M_local_buf[9] = 'e';
  local_49a8._8_8_ = (pointer)0xa;
  local_4998._M_local_buf[10] = '\0';
  if ((sVar1 == 10) &&
     (plVar3 = (long *)(typeName->_M_dataplus)._M_p,
     (short)plVar3[1] == 0x6570 && *plVar3 == 0x616853646e656c42)) {
    BlendShape::BlendShape((BlendShape *)local_49a8);
    bVar8 = ReconstructPrim<tinyusdz::BlendShape>
                      (this,&spec,(Node *)local_4d28._24_8_,psmap,(BlendShape *)local_49a8);
    if (bVar8) {
      PrimMetas::operator=((PrimMetas *)local_41e8,meta);
      ::std::__cxx11::string::_M_assign((string *)local_49a8);
      local_4988._0_4_ = spec;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)auStack_3dd8,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      pvVar6 = primChildren;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_3df0,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
      local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::BlendShape>()::table;
      pGVar10 = (GeomMesh *)operator_new(0xbe8);
      BlendShape::BlendShape((BlendShape *)pGVar10,(BlendShape *)local_49a8);
      local_4d38.dynamic = pGVar10;
      Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
      ::std::__cxx11::string::_M_assign(local_4a88);
      pPVar11 = Prim::metas((Prim *)local_4cf8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&pPVar11->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      __return_storage_ptr__->has_value_ = true;
      Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
      Prim::~Prim((Prim *)local_4cf8);
      if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
        (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x737);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                           typeName->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_4d38);
      if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
        operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
    }
    BlendShape::~BlendShape((BlendShape *)local_49a8);
    return __return_storage_ptr__;
  }
  local_4998._M_allocated_capacity._0_4_ = 0x64616853;
  local_4998._M_local_buf[4] = 'e';
  local_4998._M_local_buf[5] = 'r';
  local_49a8._8_8_ = (pointer)0x6;
  local_4998._M_local_buf[6] = '\0';
  if ((bVar8) &&
     (piVar2 = (int *)(typeName->_M_dataplus)._M_p,
     (short)piVar2[1] == 0x7265 && *piVar2 == 0x64616853)) {
    Shader::Shader((Shader *)local_49a8);
    bVar8 = ReconstructPrim<tinyusdz::Shader>
                      (this,&spec,(Node *)local_4d28._24_8_,psmap,(Shader *)local_49a8);
    if (bVar8) {
      PrimMetas::operator=((PrimMetas *)local_4978,meta);
      ::std::__cxx11::string::_M_assign((string *)local_49a8);
      local_4988._0_4_ = spec;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (local_4290,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      pvVar6 = primChildren;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&local_42a8,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
      local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::Shader>()::table;
      linb::any::do_construct<tinyusdz::Shader_const&,tinyusdz::Shader>
                ((any *)&local_4d38,(Shader *)local_49a8);
      Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
      ::std::__cxx11::string::_M_assign(local_4a88);
      pPVar11 = Prim::metas((Prim *)local_4cf8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&pPVar11->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      __return_storage_ptr__->has_value_ = true;
      Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
      Prim::~Prim((Prim *)local_4cf8);
      if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
        (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x738);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                           typeName->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_4d38);
      if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
        operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
    }
    Shader::~Shader((Shader *)local_49a8);
    return __return_storage_ptr__;
  }
  local_4998._M_allocated_capacity._0_4_ = 0x6574614d;
  local_4998._M_local_buf[4] = 'r';
  local_4998._M_local_buf[5] = 'i';
  local_4998._M_local_buf[6] = 'a';
  local_4998._M_local_buf[7] = 'l';
  local_49a8._8_8_ = (pointer)0x8;
  local_4998._M_local_buf[8] = '\0';
  if ((bVar5) && (*(long *)(typeName->_M_dataplus)._M_p == 0x6c6169726574614d)) {
    Material::Material((Material *)local_49a8);
    bVar8 = ReconstructPrim<tinyusdz::Material>
                      (this,&spec,(Node *)local_4d28._24_8_,psmap,(Material *)local_49a8);
    if (bVar8) {
      PrimMetas::operator=((PrimMetas *)local_4978,meta);
      ::std::__cxx11::string::_M_assign((string *)local_49a8);
      local_4988._0_4_ = spec;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (local_4290,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      pvVar6 = primChildren;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&local_42a8,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
      local_4d28._0_8_ = linb::any::vtable_for_type<tinyusdz::Material>()::table;
      linb::any::do_construct<tinyusdz::Material_const&,tinyusdz::Material>
                ((any *)&local_4d38,(Material *)local_49a8);
      Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d38);
      ::std::__cxx11::string::_M_assign(local_4a88);
      pPVar11 = Prim::metas((Prim *)local_4cf8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                (&pPVar11->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar6);
      __return_storage_ptr__->has_value_ = true;
      Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
      Prim::~Prim((Prim *)local_4cf8);
      if ((pointer)local_4d28._0_8_ != (pointer)0x0) {
        (**(code **)((long)&((string *)(local_4d28._0_8_ + 8))->field_2 + 8))(&local_4d38);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x739);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                           typeName->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," elementName: ",0xe);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_4d38);
      if ((GeomMesh *)local_4d38.dynamic != (GeomMesh *)local_4d28) {
        operator_delete(local_4d38.dynamic,(ulong)((long)(OpType *)local_4d28._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
    }
    Material::~Material((Material *)local_49a8);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_49a8);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_49a8,"[warn]",6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_49a8,
             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
             ,0x55);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_49a8,":",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_49a8,"ReconstructPrimFromTypeName",0x1b);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_49a8,"():",3);
  poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_49a8,0x73a);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_49a8,"TODO or unsupported prim type: ",0x1f);
  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_49a8,(typeName->_M_dataplus)._M_p,typeName->_M_string_length
                      );
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  ::std::__cxx11::stringbuf::str();
  PushWarn(this,(string *)local_4cf8);
  if ((undefined1 *)local_4cf8._0_8_ != local_4cf8 + 0x10) {
    operator_delete((void *)local_4cf8._0_8_,local_4cf8._16_8_ + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_49a8);
  ::std::ios_base::~ios_base(local_4938);
  if (pbVar7 != (bool *)0x0) {
    *pbVar7 = true;
  }
  __return_storage_ptr__->has_value_ = false;
  memset(&__return_storage_ptr__->contained,0,0x350);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Prim> USDCReader::Impl::ReconstructPrimFromTypeName(
    const std::string &typeName, // TinyUSDZ's Prim type name
    const std::string &primTypeName, // USD's Prim typeName
    const std::string &prim_name,
    const crate::CrateReader::Node &node, const Specifier spec,
    const std::vector<value::token> &primChildren,
    const std::vector<value::token> &properties,
    const PathIndexToSpecIndexMap &psmap, const PrimMeta &meta, bool *is_unsupported_prim) {

  if (is_unsupported_prim) {
    (*is_unsupported_prim) = false; // init with false
  }


#define RECONSTRUCT_PRIM(__primty, __node_ty, __prim_name, __spec) \
  if (__node_ty == value::TypeTraits<__primty>::type_name()) {     \
    __primty typed_prim;                                           \
    if (!ReconstructPrim(__spec, node, psmap, &typed_prim)) {         \
      PUSH_ERROR("Failed to reconstruct Prim " << __node_ty << " elementName: " << __prim_name);      \
      return nonstd::nullopt;                                      \
    }                                                              \
    typed_prim.meta = meta;                                        \
    typed_prim.name = __prim_name;                                 \
    typed_prim.spec = __spec;                                      \
    typed_prim.propertyNames() = properties; \
    typed_prim.primChildrenNames() = primChildren; \
    value::Value primdata = typed_prim;                            \
    Prim prim(__prim_name, primdata);                            \
    prim.prim_type_name() = primTypeName; \
    /* also add primChildren to Prim */ \
    prim.metas().primChildren = primChildren; \
    return std::move(prim); \
  }